

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

void __thiscall ON_SubD::Dump(ON_SubD *this,ON_TextLog *text_log)

{
  bool bVar1;
  uint iValue;
  uint iValue_00;
  uint iValue_01;
  ON_2udex face_id_range;
  ON_2udex edge_id_range;
  ON_2udex vertex_id_range;
  ON_2udex local_48;
  ON_2udex local_40;
  ON_2udex local_38;
  
  bVar1 = ON_TextLog::LevelOfDetailIsAtLeast(text_log,Maximum);
  iValue = 0x10;
  if (bVar1) {
    iValue = 0x7fffffff;
  }
  iValue_00 = 0x18;
  if (bVar1) {
    iValue_00 = 0x7fffffff;
  }
  iValue_01 = 0x30;
  if (bVar1) {
    iValue_01 = 0x7fffffff;
  }
  ON_2udex::ON_2udex(&local_38,iValue_00,0);
  ON_2udex::ON_2udex(&local_40,iValue_01,0);
  ON_2udex::ON_2udex(&local_48,iValue,0);
  DumpTopology(this,local_38,local_40,local_48,text_log);
  return;
}

Assistant:

void ON_SubD::Dump(ON_TextLog& text_log) const
{
  // At maximum verbosity, dump all vertices, edges, faces, else dump the first 16.
  const unsigned maxcount = 0x7FFFFFFF;

  const unsigned face_count = text_log.LevelOfDetailIsAtLeast(ON_TextLog::LevelOfDetail::Maximum) ? maxcount : 16;

  // Bump vertex_count up a bit to deal with small models with lots of hexagons.
  const unsigned vertex_count = face_count < maxcount ? (3 * face_count) / 2 : maxcount;

  // And ... edge_count is set this way because in a typical control net,
  // vertex count - edge count + face count is nearish to zero.
  // (Euler's formula)
  const unsigned edge_count = face_count < maxcount ? (vertex_count + face_count + 8) : maxcount;

  const ON_2udex vertex_id_range(vertex_count, 0);
  const ON_2udex edge_id_range(edge_count, 0);
  const ON_2udex face_id_range(face_count, 0);

  DumpTopology(vertex_id_range,edge_id_range,face_id_range,text_log);
}